

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

float ImGui::ScaleValueFromRatioT<float,float,float>
                (ImGuiDataType data_type,float t,float v_min,float v_max,bool is_logarithmic,
                float logarithmic_zero_epsilon,float zero_deadzone_halfsize)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  float fVar4;
  float fVar5;
  float fVar6;
  undefined1 in_register_00001204 [60];
  undefined1 auVar7 [64];
  undefined1 in_register_00001244 [60];
  undefined1 auVar8 [64];
  undefined1 auVar9 [16];
  undefined1 in_register_00001284 [60];
  undefined1 auVar10 [64];
  undefined1 auVar11 [16];
  undefined1 in_register_000012c4 [60];
  undefined1 auVar12 [64];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  float fVar17;
  undefined1 local_18 [16];
  
  auVar12._4_60_ = in_register_000012c4;
  auVar12._0_4_ = logarithmic_zero_epsilon;
  auVar10._4_60_ = in_register_00001284;
  auVar10._0_4_ = v_max;
  auVar8._4_60_ = in_register_00001244;
  auVar8._0_4_ = v_min;
  auVar11 = auVar8._0_16_;
  auVar7._4_60_ = in_register_00001204;
  auVar7._0_4_ = t;
  auVar9 = auVar11;
  if ((v_min == v_max) && (!NAN(v_min) && !NAN(v_max))) goto LAB_001835e7;
  auVar13 = auVar10._0_16_;
  if (!is_logarithmic) {
    if ((data_type & 0xfffffffeU) == 8) {
      return (v_max - v_min) * t + v_min;
    }
    auVar9 = auVar13;
    if (t < 1.0) {
      auVar9 = vcmpss_avx(auVar13,auVar11,1);
      auVar11._8_4_ = 0xbf000000;
      auVar11._0_8_ = 0xbf000000bf000000;
      auVar11._12_4_ = 0xbf000000;
      auVar13._8_4_ = 0x3f000000;
      auVar13._0_8_ = 0x3f0000003f000000;
      auVar13._12_4_ = 0x3f000000;
      auVar9 = vblendvps_avx(auVar13,auVar11,auVar9);
      auVar9 = ZEXT416((uint)((v_max - v_min) * t + auVar9._0_4_ + v_min));
    }
    goto LAB_001835e7;
  }
  if ((t <= 0.0) || (auVar9 = auVar13, 1.0 <= t)) goto LAB_001835e7;
  auVar15._8_4_ = 0x7fffffff;
  auVar15._0_8_ = 0x7fffffff7fffffff;
  auVar15._12_4_ = 0x7fffffff;
  auVar16._0_8_ = CONCAT44(in_register_000012c4._0_4_,logarithmic_zero_epsilon) ^ 0x8000000080000000
  ;
  auVar16._8_4_ = in_register_000012c4._4_4_ ^ 0x80000000;
  auVar16._12_4_ = in_register_000012c4._8_4_ ^ 0x80000000;
  auVar14 = ZEXT816(0) << 0x40;
  auVar9 = vcmpss_avx(auVar11,auVar14,1);
  local_18 = auVar12._0_16_;
  auVar2 = vblendvps_avx(local_18,auVar16,auVar9);
  auVar9 = vandps_avx(auVar15,auVar11);
  auVar9 = vcmpss_avx(auVar9,local_18,1);
  auVar2 = vblendvps_avx(auVar11,auVar2,auVar9);
  auVar9 = vcmpss_avx(auVar13,auVar14,1);
  auVar3 = vblendvps_avx(local_18,auVar16,auVar9);
  auVar9 = vandps_avx(auVar15,auVar13);
  auVar9 = vcmpss_avx(auVar9,local_18,1);
  auVar9 = vblendvps_avx(auVar13,auVar3,auVar9);
  auVar3 = auVar2;
  if (v_min <= v_max) {
    auVar3 = auVar9;
    auVar9 = auVar2;
  }
  if (v_min < 0.0) {
    auVar2 = vcmpss_avx(auVar13,auVar14,0);
    auVar3 = vblendvps_avx(auVar3,auVar16,auVar2);
  }
  auVar2 = vcmpss_avx(auVar13,auVar11,1);
  auVar2 = vblendvps_avx(auVar7._0_16_,ZEXT416((uint)(1.0 - t)),auVar2);
  fVar5 = auVar2._0_4_;
  fVar6 = auVar3._0_4_;
  fVar17 = auVar9._0_4_;
  if (0.0 <= v_min * v_max) {
    if ((v_min < 0.0) || (v_max < 0.0)) {
      fVar6 = fVar17 / fVar6;
      fVar5 = 1.0 - fVar5;
      local_18 = auVar3;
    }
    else {
      fVar6 = fVar6 / fVar17;
      local_18 = auVar9;
    }
LAB_001837b8:
    fVar5 = powf(fVar6,fVar5);
  }
  else {
    auVar11 = vminss_avx(auVar11,auVar13);
    auVar9._8_4_ = 0x7fffffff;
    auVar9._0_8_ = 0x7fffffff7fffffff;
    auVar9._12_4_ = 0x7fffffff;
    auVar9 = vandps_avx(ZEXT416((uint)(v_max - v_min)),auVar9);
    fVar4 = -auVar11._0_4_ / auVar9._0_4_;
    fVar1 = fVar4 + zero_deadzone_halfsize;
    if ((fVar4 - zero_deadzone_halfsize <= fVar5) && (auVar9 = ZEXT816(0) << 0x20, fVar5 <= fVar1))
    goto LAB_001835e7;
    if (fVar4 <= fVar5) {
      fVar6 = fVar6 / logarithmic_zero_epsilon;
      fVar5 = (fVar5 - fVar1) / (1.0 - fVar1);
      goto LAB_001837b8;
    }
    fVar5 = powf(-fVar17 / logarithmic_zero_epsilon,1.0 - fVar5 / (fVar4 - zero_deadzone_halfsize));
    fVar5 = -fVar5;
  }
  auVar9 = ZEXT416((uint)(fVar5 * (float)local_18._0_4_));
LAB_001835e7:
  return auVar9._0_4_;
}

Assistant:

TYPE ImGui::ScaleValueFromRatioT(ImGuiDataType data_type, float t, TYPE v_min, TYPE v_max, bool is_logarithmic, float logarithmic_zero_epsilon, float zero_deadzone_halfsize)
{
    if (v_min == v_max)
        return v_min;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);

    TYPE result;
    if (is_logarithmic)
    {
        // We special-case the extents because otherwise our fudging can lead to "mathematically correct" but non-intuitive behaviors like a fully-left slider not actually reaching the minimum value
        if (t <= 0.0f)
            result = v_min;
        else if (t >= 1.0f)
            result = v_max;
        else
        {
            bool flipped = v_max < v_min; // Check if range is "backwards"

            // Fudge min/max to avoid getting silly results close to zero
            FLOATTYPE v_min_fudged = (ImAbs((FLOATTYPE)v_min) < logarithmic_zero_epsilon) ? ((v_min < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_min;
            FLOATTYPE v_max_fudged = (ImAbs((FLOATTYPE)v_max) < logarithmic_zero_epsilon) ? ((v_max < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_max;

            if (flipped)
                ImSwap(v_min_fudged, v_max_fudged);

            // Awkward special case - we need ranges of the form (-100 .. 0) to convert to (-100 .. -epsilon), not (-100 .. epsilon)
            if ((v_max == 0.0f) && (v_min < 0.0f))
                v_max_fudged = -logarithmic_zero_epsilon;

            float t_with_flip = flipped ? (1.0f - t) : t; // t, but flipped if necessary to account for us flipping the range

            if ((v_min * v_max) < 0.0f) // Range crosses zero, so we have to do this in two parts
            {
                float zero_point_center = (-(float)ImMin(v_min, v_max)) / ImAbs((float)v_max - (float)v_min); // The zero point in parametric space
                float zero_point_snap_L = zero_point_center - zero_deadzone_halfsize;
                float zero_point_snap_R = zero_point_center + zero_deadzone_halfsize;
                if (t_with_flip >= zero_point_snap_L && t_with_flip <= zero_point_snap_R)
                    result = (TYPE)0.0f; // Special case to make getting exactly zero possible (the epsilon prevents it otherwise)
                else if (t_with_flip < zero_point_center)
                    result = (TYPE)-(logarithmic_zero_epsilon * ImPow(-v_min_fudged / logarithmic_zero_epsilon, (FLOATTYPE)(1.0f - (t_with_flip / zero_point_snap_L))));
                else
                    result = (TYPE)(logarithmic_zero_epsilon * ImPow(v_max_fudged / logarithmic_zero_epsilon, (FLOATTYPE)((t_with_flip - zero_point_snap_R) / (1.0f - zero_point_snap_R))));
            }
            else if ((v_min < 0.0f) || (v_max < 0.0f)) // Entirely negative slider
                result = (TYPE)-(-v_max_fudged * ImPow(-v_min_fudged / -v_max_fudged, (FLOATTYPE)(1.0f - t_with_flip)));
            else
                result = (TYPE)(v_min_fudged * ImPow(v_max_fudged / v_min_fudged, (FLOATTYPE)t_with_flip));
        }
    }
    else
    {
        // Linear slider
        if (is_decimal)
        {
            result = ImLerp(v_min, v_max, t);
        }
        else
        {
            // - For integer values we want the clicking position to match the grab box so we round above
            //   This code is carefully tuned to work with large values (e.g. high ranges of U64) while preserving this property..
            // - Not doing a *1.0 multiply at the end of a range as it tends to be lossy. While absolute aiming at a large s64/u64
            //   range is going to be imprecise anyway, with this check we at least make the edge values matches expected limits.
            if (t < 1.0)
            {
                FLOATTYPE v_new_off_f = (SIGNEDTYPE)(v_max - v_min) * t;
                result = (TYPE)((SIGNEDTYPE)v_min + (SIGNEDTYPE)(v_new_off_f + (FLOATTYPE)(v_min > v_max ? -0.5 : 0.5)));
            }
            else
            {
                result = v_max;
            }
        }
    }

    return result;
}